

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::LJoint::Solve(LJoint *this,btScalar dt,btScalar sor)

{
  Impulse *in_RDI;
  Impulse impulse;
  btVector3 vr;
  btVector3 vb;
  btVector3 va;
  btScalar *rpos;
  btVector3 *in_stack_ffffffffffffff28;
  Impulse *impulse_00;
  btVector3 *in_stack_ffffffffffffff38;
  Body *in_stack_ffffffffffffff40;
  Impulse *in_stack_ffffffffffffff50;
  
  Body::velocity(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  Body::velocity(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  operator-(&in_RDI->m_velocity,in_stack_ffffffffffffff28);
  Impulse::Impulse(in_RDI);
  rpos = in_RDI[3].m_drift.m_floats + 2;
  ::operator*(&in_RDI->m_velocity,in_stack_ffffffffffffff28->m_floats);
  operator+(&in_RDI->m_velocity,in_stack_ffffffffffffff28);
  ::operator*((btMatrix3x3 *)in_RDI,in_stack_ffffffffffffff28);
  ::operator*(&in_RDI->m_velocity,in_stack_ffffffffffffff28->m_floats);
  impulse_00 = (Impulse *)((in_RDI->m_velocity).m_floats + 2);
  Impulse::operator-(in_stack_ffffffffffffff50);
  Body::applyImpulse((Body *)in_RDI,impulse_00,(btVector3 *)rpos);
  Body::applyImpulse((Body *)in_RDI,impulse_00,(btVector3 *)rpos);
  return;
}

Assistant:

void				btSoftBody::LJoint::Solve(btScalar dt,btScalar sor)
{
	const btVector3		va=m_bodies[0].velocity(m_rpos[0]);
	const btVector3		vb=m_bodies[1].velocity(m_rpos[1]);
	const btVector3		vr=va-vb;
	btSoftBody::Impulse	impulse;
	impulse.m_asVelocity	=	1;
	impulse.m_velocity		=	m_massmatrix*(m_drift+vr*m_cfm)*sor;
	m_bodies[0].applyImpulse(-impulse,m_rpos[0]);
	m_bodies[1].applyImpulse( impulse,m_rpos[1]);
}